

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkMemAbstractTest(Wlc_Ntk_t *p)

{
  char cVar1;
  void *__ptr;
  Vec_Int_t *vMemObjs;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Wlc_Ntk_t *pWVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int Count;
  ulong uVar10;
  int iFirstMemCi;
  int iFirstCi;
  int iFirstMemPi;
  Vec_Int_t *local_38;
  
  vMemObjs = Wlc_NtkCollectMemory(p,0);
  local_38 = Wlc_NtkCollectMemFanins(p,vMemObjs);
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar2 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pVVar4 = Vec_WecPushLevel(p_00);
  Vec_IntPush(pVVar4,0x5800);
  Vec_IntPush(pVVar4,0x5000);
  Vec_IntPush(pVVar4,0x4000);
  Vec_IntPush(pVVar4,0x4800);
  Wlc_NtkAbsAddToNodeFrames(pVVar2,pVVar4);
  pWVar5 = Wlc_NtkAbstractMemory
                     (p,vMemObjs,(Vec_Int_t *)0x0,&iFirstMemPi,&iFirstCi,&iFirstMemCi,p_00,pVVar2);
  if (0 < p_00->nCap) {
    lVar9 = 8;
    lVar8 = 0;
    do {
      __ptr = *(void **)((long)&p_00->pArray->nCap + lVar9);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&p_00->pArray->nCap + lVar9) = 0;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < p_00->nCap);
  }
  if (p_00->pArray != (Vec_Int_t *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (Vec_Int_t *)0x0;
  }
  p_00->nCap = 0;
  p_00->nSize = 0;
  free(p_00);
  pVVar4 = local_38;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  free(pVVar2);
  pcVar6 = pWVar5->pInits;
  uVar10 = 0;
  do {
    cVar1 = *pcVar6;
    uVar7 = 1;
    if (cVar1 != 'x') {
      if (cVar1 == '\0') {
        printf("iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n",
               (ulong)(uint)iFirstMemPi,(ulong)(uint)iFirstCi,(ulong)(uint)iFirstMemCi,uVar10);
        if (vMemObjs != (Vec_Int_t *)0x0) {
          if (vMemObjs->pArray != (int *)0x0) {
            free(vMemObjs->pArray);
            vMemObjs->pArray = (int *)0x0;
          }
          free(vMemObjs);
        }
        if (pVVar4 != (Vec_Int_t *)0x0) {
          if (pVVar4->pArray != (int *)0x0) {
            free(pVVar4->pArray);
            pVVar4->pArray = (int *)0x0;
          }
          free(pVVar4);
        }
        return pWVar5;
      }
      uVar7 = (uint)(cVar1 == 'X');
    }
    uVar10 = (ulong)((int)uVar10 + uVar7);
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

Wlc_Ntk_t * Wlc_NtkMemAbstractTest( Wlc_Ntk_t * p )
{
    int iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits;
    Vec_Int_t * vRefine;
    Vec_Int_t * vMemObjs    = Wlc_NtkCollectMemory( p, 0 );
    Vec_Int_t * vMemFanins  = Wlc_NtkCollectMemFanins( p, vMemObjs );

    Vec_Wec_t * vRefines    = Vec_WecAlloc( 100 );
    Vec_Int_t * vNodeFrames = Vec_IntAlloc( 100 );
    Wlc_Ntk_t * pNewFull;

    vRefine     = Vec_WecPushLevel(vRefines);
    Vec_IntPush( vRefine,  (11 << 11) | 0 );
    Vec_IntPush( vRefine,  (10 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 8 << 11) | 0 );
    Vec_IntPush( vRefine,  ( 9 << 11) | 0 );
    Wlc_NtkAbsAddToNodeFrames( vNodeFrames, vRefine );

//    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, vMemFanins, &iFirstMemPi, &iFirstCi, &iFirstMemCi, NULL, NULL );
    pNewFull    = Wlc_NtkAbstractMemory( p, vMemObjs, NULL, &iFirstMemPi, &iFirstCi, &iFirstMemCi, vRefines, vNodeFrames );

    Vec_WecFree( vRefines );
    Vec_IntFree( vNodeFrames );

    nDcBits     = Wlc_CountDcs( pNewFull->pInits );
    printf( "iFirstMemPi = %d  iFirstCi = %d  iFirstMemCi = %d  nDcBits = %d\n", iFirstMemPi, iFirstCi, iFirstMemCi, nDcBits );

    Vec_IntFreeP( &vMemObjs );
    Vec_IntFreeP( &vMemFanins );
    return pNewFull;
}